

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O2

void onig_regset_free(OnigRegSet *set)

{
  RR *__ptr;
  OnigRegion *r;
  long lVar1;
  long lVar2;
  
  lVar2 = 8;
  for (lVar1 = 0; __ptr = set->rs, lVar1 < set->n; lVar1 = lVar1 + 1) {
    r = *(OnigRegion **)((long)&__ptr->reg + lVar2);
    onig_free(*(regex_t **)((long)__ptr + lVar2 + -8));
    if (r != (OnigRegion *)0x0) {
      onig_region_free(r,1);
    }
    lVar2 = lVar2 + 0x10;
  }
  free(__ptr);
  free(set);
  return;
}

Assistant:

extern void
onig_regset_free(OnigRegSet* set)
{
  int i;

  for (i = 0; i < set->n; i++) {
    regex_t* reg;
    OnigRegion* region;

    reg    = set->rs[i].reg;
    region = set->rs[i].region;
    onig_free(reg);
    if (IS_NOT_NULL(region))
      onig_region_free(region, 1);
  }

  xfree(set->rs);
  xfree(set);
}